

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mailbox_safe.cpp
# Opt level: O3

void __thiscall zmq::mailbox_safe_t::~mailbox_safe_t(mailbox_safe_t *this)

{
  atomic_ptr_t<zmq::yqueue_t<zmq::command_t,_16>::chunk_t> *paVar1;
  __pointer_type __ptr;
  pointer ppsVar2;
  chunk_t *__ptr_00;
  int iVar3;
  char *pcVar4;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)this->_sync);
  if (iVar3 != 0) {
    pcVar4 = strerror(iVar3);
    fprintf(_stderr,"%s (%s:%d)\n",pcVar4,
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/mutex.hpp"
            ,0x88);
    fflush(_stderr);
    zmq_abort(pcVar4);
  }
  iVar3 = pthread_mutex_unlock((pthread_mutex_t *)this->_sync);
  if (iVar3 != 0) {
    pcVar4 = strerror(iVar3);
    fprintf(_stderr,"%s (%s:%d)\n",pcVar4,
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/mutex.hpp"
            ,0x98);
    fflush(_stderr);
    zmq_abort(pcVar4);
  }
  ppsVar2 = (this->_signalers).
            super__Vector_base<zmq::signaler_t_*,_std::allocator<zmq::signaler_t_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppsVar2 != (pointer)0x0) {
    operator_delete(ppsVar2,(long)(this->_signalers).
                                  super__Vector_base<zmq::signaler_t_*,_std::allocator<zmq::signaler_t_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppsVar2
                   );
  }
  std::_V2::condition_variable_any::~condition_variable_any(&(this->_cond_var)._cv);
  while (__ptr_00 = (this->_cpipe)._queue._begin_chunk, __ptr_00 != (this->_cpipe)._queue._end_chunk
        ) {
    (this->_cpipe)._queue._begin_chunk = __ptr_00->next;
    free(__ptr_00);
  }
  free(__ptr_00);
  LOCK();
  paVar1 = &(this->_cpipe)._queue._spare_chunk;
  __ptr = (paVar1->_ptr)._M_b._M_p;
  (paVar1->_ptr)._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  free(__ptr);
  return;
}

Assistant:

zmq::mailbox_safe_t::~mailbox_safe_t ()
{
    //  TODO: Retrieve and deallocate commands inside the cpipe.

    // Work around problem that other threads might still be in our
    // send() method, by waiting on the mutex before disappearing.
    _sync->lock ();
    _sync->unlock ();
}